

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

void __thiscall CppGenerator::computeParallelizeGroup(CppGenerator *this,bool paralleize_groups)

{
  TreeDecomposition *this_00;
  uint uVar1;
  bool *__s;
  size_t *__s_00;
  pointer pvVar2;
  View *pVVar3;
  TDNode *pTVar4;
  ulong uVar5;
  undefined7 in_register_00000031;
  long lVar6;
  ulong uVar7;
  
  lVar6 = (long)(this->viewGroups).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->viewGroups).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar7 = lVar6 * -0x5555555555555555;
  __s = (bool *)operator_new__(uVar7);
  memset(__s,0,uVar7);
  this->_parallelizeGroup = __s;
  uVar7 = -(ulong)(uVar7 >> 0x3d != 0) | lVar6 * 0x5555555555555558;
  __s_00 = (size_t *)operator_new__(uVar7);
  memset(__s_00,0,uVar7);
  this->_threadsPerGroup = __s_00;
  if (((int)CONCAT71(in_register_00000031,paralleize_groups) != 0) &&
     (pvVar2 = (this->viewGroups).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (this->viewGroups).
     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish != pvVar2)) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      this_00 = (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      pVVar3 = QueryCompiler::getView
                         ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,**(size_t **)
                                   ((long)&(pvVar2->
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           )._M_impl.super__Vector_impl_data._M_start + lVar6));
      pTVar4 = TreeDecomposition::getRelation(this_00,(ulong)pVVar3->_origin);
      if (1 < pTVar4->_threads) {
        this->_parallelizeGroup[uVar7] = true;
        uVar1 = std::thread::hardware_concurrency();
        uVar5 = (ulong)uVar1;
        if (pTVar4->_threads < (ulong)uVar1) {
          uVar5 = pTVar4->_threads;
        }
        this->_threadsPerGroup[uVar7] = uVar5;
      }
      uVar7 = uVar7 + 1;
      pvVar2 = (this->viewGroups).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x18;
    } while (uVar7 < (ulong)(((long)(this->viewGroups).
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void CppGenerator::computeParallelizeGroup(bool paralleize_groups)
{
    _parallelizeGroup = new bool[viewGroups.size()]();
    _threadsPerGroup = new size_t[viewGroups.size()]();

    if (!paralleize_groups)
        return;
    
    for (size_t gid = 0; gid < viewGroups.size(); ++gid)
    {
        TDNode* node = _td->getRelation(_qc->getView(viewGroups[gid][0])->_origin);

        if (node->_threads > 1)
        {
            _parallelizeGroup[gid] = true;            
            _threadsPerGroup[gid] =
                std::min(node->_threads, (size_t)std::thread::hardware_concurrency());
        }        
    }
}